

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz_wrapper.hpp
# Opt level: O2

void duckdb::MiniZStream::InitializeGZIPFooter
               (uchar *gzip_footer,mz_ulong crc,idx_t uncompressed_size)

{
  *gzip_footer = (uchar)crc;
  gzip_footer[1] = (uchar)(crc >> 8);
  gzip_footer[2] = (uchar)(crc >> 0x10);
  gzip_footer[3] = (uchar)(crc >> 0x18);
  gzip_footer[4] = (uchar)uncompressed_size;
  gzip_footer[5] = (uchar)(uncompressed_size >> 8);
  gzip_footer[6] = (uchar)(uncompressed_size >> 0x10);
  gzip_footer[7] = (uchar)(uncompressed_size >> 0x18);
  return;
}

Assistant:

static void InitializeGZIPFooter(unsigned char *gzip_footer, duckdb_miniz::mz_ulong crc, idx_t uncompressed_size) {
		gzip_footer[0] = crc & 0xFF;
		gzip_footer[1] = (crc >> 8) & 0xFF;
		gzip_footer[2] = (crc >> 16) & 0xFF;
		gzip_footer[3] = (crc >> 24) & 0xFF;
		gzip_footer[4] = uncompressed_size & 0xFF;
		gzip_footer[5] = (uncompressed_size >> 8) & 0xFF;
		gzip_footer[6] = (uncompressed_size >> 16) & 0xFF;
		gzip_footer[7] = (uncompressed_size >> 24) & 0xFF;
	}